

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char **argv_local;
  int argc_local;
  
  glfwSetErrorCallback(Error);
  glfwInit();
  glfwWindowHint(0x20004,0);
  window = glfwCreateWindow(0xfa,0xfa,*argv,(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (window == (GLFWwindow *)0x0) {
    argv_local._4_4_ = 0x7d;
  }
  else {
    glfwMakeContextCurrent(window);
    Init();
    Reshape();
    Draw();
    glfwDestroyWindow(window);
    glfwTerminate();
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int
main(int argc, char **argv)
{
   glfwSetErrorCallback(&Error);

   glfwInit();

   glfwWindowHint(GLFW_VISIBLE, GL_FALSE);

   window = glfwCreateWindow(250, 250, argv[0], NULL, NULL);
   if (!window) {
      return EXIT_SKIP;
   }

   glfwMakeContextCurrent(window);

   Init();
   Reshape();
   Draw();

   glfwDestroyWindow(window);
   glfwTerminate();

   return 0;
}